

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticQuad>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  bool bVar1;
  TPZGeoEl *pTVar2;
  TPZGeoEl *in_RCX;
  long *in_RSI;
  long *in_RDI;
  int side;
  int64_t neighIdx;
  TPZGeoElSide neigh;
  int n;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_000002c0
  ;
  TPZGeoEl *in_stack_000002c8;
  TPZGeoMesh *in_stack_000002d0;
  void **in_stack_000002d8;
  TPZGeoEl *in_stack_000002e0;
  TPZGeoElSide *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  TPZGeoElSide *in_stack_fffffffffffffef8;
  TPZGeoMesh *in_stack_ffffffffffffff00;
  iterator in_stack_ffffffffffffff08;
  TPZQuadraticQuad *in_stack_ffffffffffffff10;
  TPZGeoElSide *this_00;
  long *__k;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *this_01;
  TPZGeoElSideIndex local_b0 [2];
  _Self local_80;
  _Self local_78;
  int local_6c;
  int64_t local_68;
  TPZGeoElSide local_60;
  undefined4 local_44;
  int local_40;
  TPZGeoEl *local_20;
  
  local_20 = in_RCX;
  TPZGeoEl::TPZGeoEl(in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,
                     in_stack_000002c0);
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x60)) = in_RSI[3];
  pzgeom::TPZQuadraticQuad::TPZQuadraticQuad
            (in_stack_ffffffffffffff10,(TPZQuadraticQuad *)in_stack_ffffffffffffff08._M_node,
             (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             in_stack_ffffffffffffff00);
  this_01 = (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
            (in_RDI + 0x11);
  __k = in_RDI + 0x2c;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    this_01 = (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
              ((long)this_01 + 0x18);
  } while (this_01 !=
           (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)__k);
  local_44 = 9;
  for (local_40 = 0; local_40 < 9; local_40 = local_40 + 1) {
    this_00 = (TPZGeoElSide *)(&local_20[2].fMesh + (long)local_40 * 3);
    TPZGeoEl::Mesh(local_20);
    TPZGeoElSide::TPZGeoElSide
              (this_00,(TPZGeoElSideIndex *)in_stack_ffffffffffffff08._M_node,
               in_stack_ffffffffffffff00);
    pTVar2 = TPZGeoElSide::Element(&local_60);
    local_68 = TPZGeoEl::Index(pTVar2);
    local_6c = TPZGeoElSide::Side(&local_60);
    while( true ) {
      in_stack_ffffffffffffff08 =
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           find((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
                in_stack_fffffffffffffee8,(key_type_conflict1 *)0x179f147);
      local_78._M_node = in_stack_ffffffffffffff08._M_node;
      local_80._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                     ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                       *)in_stack_fffffffffffffee8);
      bVar1 = std::operator==(&local_78,&local_80);
      if (!bVar1) break;
      TPZGeoElSide::Neighbour(in_stack_fffffffffffffef8);
      TPZGeoElSide::operator=
                ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x179f1c7);
      pTVar2 = TPZGeoElSide::Element(&local_60);
      local_68 = TPZGeoEl::Index(pTVar2);
      local_6c = TPZGeoElSide::Side(&local_60);
    }
    in_stack_ffffffffffffff00 =
         (TPZGeoMesh *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[](this_01,__k);
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)in_stack_ffffffffffffff00,(int64_t)in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef4);
    TPZGeoElSideIndex::operator=((TPZGeoElSideIndex *)(in_RDI + (long)local_40 * 3 + 0x11),local_b0)
    ;
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x179f2b9);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x179f2c6);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}